

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::encode_rice(symbol_codec *this,uint v,uint m)

{
  byte in_DL;
  uint in_ESI;
  symbol_codec *in_RDI;
  uint r;
  uint q;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 local_14;
  
  for (local_14 = in_ESI >> (in_DL & 0x1f); 0x10 < local_14; local_14 = local_14 - 0x10) {
    encode_bits(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  if (local_14 != 0) {
    encode_bits(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  encode_bits(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  encode_bits(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void symbol_codec::encode_rice(uint v, uint m) {
  CRNLIB_ASSERT(m > 0);

  uint q = v >> m;
  uint r = v & ((1 << m) - 1);

  while (q > 16) {
    encode_bits(0xFFFF, 16);
    q -= 16;
  }

  if (q)
    encode_bits((1 << q) - 1, q);

  encode_bits(0, 1);

  encode_bits(r, m);
}